

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlNodePtr xmlTextReaderPreserve(xmlTextReaderPtr reader)

{
  xmlSAXHandlerPtr local_28;
  xmlNodePtr parent;
  xmlNodePtr cur;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    reader_local = (xmlTextReaderPtr)reader->node;
    if (reader_local == (xmlTextReaderPtr)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      if ((*(xmlElementType *)&reader_local->doc != XML_DOCUMENT_NODE) &&
         (*(xmlElementType *)&reader_local->doc != XML_DTD_NODE)) {
        *(unsigned_short *)((long)&reader_local->node + 2) =
             *(unsigned_short *)((long)&reader_local->node + 2) | 2;
        *(unsigned_short *)((long)&reader_local->node + 2) =
             *(unsigned_short *)((long)&reader_local->node + 2) | 4;
      }
      reader->preserves = reader->preserves + 1;
      for (local_28 = reader_local->sax; local_28 != (xmlSAXHandlerPtr)0x0;
          local_28 = (xmlSAXHandlerPtr)local_28->getEntity) {
        if (*(xmlElementType *)&local_28->isStandalone == XML_ELEMENT_NODE) {
          *(unsigned_short *)((long)&local_28->startElement + 2) =
               *(unsigned_short *)((long)&local_28->startElement + 2) | 2;
        }
      }
    }
  }
  return (xmlNodePtr)reader_local;
}

Assistant:

xmlNodePtr
xmlTextReaderPreserve(xmlTextReaderPtr reader) {
    xmlNodePtr cur, parent;

    if (reader == NULL)
	return(NULL);

    cur = reader->node;
    if (cur == NULL)
        return(NULL);

    if ((cur->type != XML_DOCUMENT_NODE) && (cur->type != XML_DTD_NODE)) {
	cur->extra |= NODE_IS_PRESERVED;
	cur->extra |= NODE_IS_SPRESERVED;
    }
    reader->preserves++;

    parent = cur->parent;;
    while (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE)
	    parent->extra |= NODE_IS_PRESERVED;
	parent = parent->parent;
    }
    return(cur);
}